

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

int as_escaped_char(int c,int chr)

{
  uint uVar1;
  
  switch(c) {
  case 7:
    return 0x61;
  case 8:
    return 0x62;
  case 9:
    return 0x74;
  case 10:
    return 0x6e;
  case 0xb:
    return 0x76;
  case 0xc:
    return 0x66;
  case 0xd:
    return 0x72;
  }
  if (c != 0x5c) {
    uVar1 = 0x27;
    if (c != 0x27 || chr == 0) {
      uVar1 = -(uint)(c != 0x22 || chr != 0) | 0x22;
    }
    return uVar1;
  }
  return 0x5c;
}

Assistant:

static int as_escaped_char(int c, int chr)
{
    switch(c)
    {
        case '\a': return 'a';
        case '\b': return 'b';
        case '\t': return 't';
        case '\n': return 'n';
        case '\v': return 'v';
        case '\f': return 'f';
        case '\r': return 'r';
        case '\\': return '\\';
        default:
            if(chr && c == '\'')
                return '\'';
            else if(!chr && c == '"')
                return '"';
            else return -1;
    }
}